

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall ON_NurbsSurface::IsClosed(ON_NurbsSurface *this,int dir)

{
  double *pointA;
  bool bVar1;
  uint uVar2;
  double *pointB;
  int j;
  double *pdVar3;
  int iVar4;
  double *pointB_00;
  double *pointA_00;
  
  if (((uint)dir < 2) && (0 < this->m_dim)) {
    bVar1 = ON_IsKnotVectorClamped
                      (this->m_order[(uint)dir],this->m_cv_count[(uint)dir],this->m_knot[(uint)dir],
                       2);
    if (!bVar1) {
      iVar4 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x31])
                        (this,(ulong)(uint)dir);
      return SUB41(iVar4,0);
    }
    pointA = this->m_cv;
    iVar4 = this->m_cv_count[0] + -1;
    uVar2 = this->m_cv_stride[0] * iVar4;
    pointA_00 = pointA + uVar2;
    if ((int)uVar2 < 0) {
      pointA_00 = (double *)0x0;
    }
    j = this->m_cv_count[1] + -1;
    uVar2 = this->m_cv_stride[1] * j;
    pdVar3 = pointA + uVar2;
    if ((int)uVar2 < 0) {
      pdVar3 = (double *)0x0;
    }
    if (pointA == (double *)0x0) {
      pdVar3 = (double *)0x0;
      pointA_00 = (double *)0x0;
    }
    pointB_00 = pdVar3;
    if (dir == 0) {
      pointB_00 = pointA_00;
    }
    pointB = CV(this,iVar4,j);
    bVar1 = ON_PointsAreCoincident(this->m_dim,this->m_is_rat != 0,pointA,pointB_00);
    if (bVar1) {
      if (dir == 0) {
        pointA_00 = pdVar3;
      }
      bVar1 = ON_PointsAreCoincident(this->m_dim,this->m_is_rat != 0,pointA_00,pointB);
      if (bVar1) {
        bVar1 = ON_IsPointGridClosed
                          (this->m_dim,this->m_is_rat != 0,this->m_cv_count[0],this->m_cv_count[1],
                           this->m_cv_stride[0],this->m_cv_stride[1],this->m_cv,dir);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool 
ON_NurbsSurface::IsClosed( int dir ) const
{
  bool bIsClosed = false;
  if ( dir >= 0 && dir <= 1 && m_dim > 0 )
  {
    if ( ON_IsKnotVectorClamped( m_order[dir], m_cv_count[dir], m_knot[dir] ) )
    {
      const double* corners[4];
      corners[0] = CV(0,0);
      corners[(0==dir)?1:2] = CV(m_cv_count[0]-1,0);
      corners[(0==dir)?2:1] = CV(0,m_cv_count[1]-1);
      corners[3] = CV(m_cv_count[0]-1,m_cv_count[1]-1);
      if (    ON_PointsAreCoincident(m_dim,m_is_rat,corners[0],corners[1])
           && ON_PointsAreCoincident(m_dim,m_is_rat,corners[2],corners[3])
           && ON_IsPointGridClosed( m_dim, m_is_rat, m_cv_count[0], m_cv_count[1], m_cv_stride[0], m_cv_stride[1], m_cv, dir ) 
         )
      {
        bIsClosed = true;
      }
    }
    else if ( IsPeriodic(dir) )
    {
      bIsClosed = true;
    }
  }
  return bIsClosed;
}